

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpTestLog.c
# Opt level: O2

deBool qpTestLog_writeCompileInfo
                 (qpTestLog *log,char *name,char *description,deBool compileOk,char *infoLog)

{
  deBool dVar1;
  qpXmlAttribute attribs [3];
  
  deMutex_lock(log->lock);
  attribs[0].name = "Name";
  attribs[0].type = QP_XML_ATTRIBUTE_STRING;
  attribs[0].intValue = -0x2a6;
  attribs[0].boolValue = -1;
  attribs[1].name = "Description";
  attribs[1].type = QP_XML_ATTRIBUTE_STRING;
  attribs[1].intValue = -0x2a6;
  attribs[1].boolValue = -1;
  attribs[2].stringValue = "OK";
  if (compileOk == 0) {
    attribs[2].stringValue = "Fail";
  }
  attribs[2].name = "CompileStatus";
  attribs[2].type = QP_XML_ATTRIBUTE_STRING;
  attribs[2].intValue = -0x2a6;
  attribs[2].boolValue = -1;
  attribs[0].stringValue = name;
  attribs[1].stringValue = description;
  dVar1 = qpXmlWriter_startElement(log->writer,"CompileInfo",3,attribs);
  if (dVar1 != 0) {
    dVar1 = qpXmlWriter_writeStringElement(log->writer,"InfoLog",infoLog);
    if (dVar1 != 0) {
      dVar1 = qpXmlWriter_endElement(log->writer,"CompileInfo");
      if (dVar1 != 0) {
        dVar1 = 1;
        goto LAB_00213efa;
      }
    }
  }
  dVar1 = 0;
  qpPrintf("qpTestLog_writeCompileInfo(): Writing XML failed\n");
LAB_00213efa:
  deMutex_unlock(log->lock);
  return dVar1;
}

Assistant:

deBool qpTestLog_writeCompileInfo (qpTestLog* log, const char* name, const char* description, deBool compileOk, const char* infoLog)
{
	int				numAttribs = 0;
	qpXmlAttribute	attribs[3];

	DE_ASSERT(log && name && description && infoLog);
	deMutex_lock(log->lock);

	attribs[numAttribs++] = qpSetStringAttrib("Name", name);
	attribs[numAttribs++] = qpSetStringAttrib("Description", description);
	attribs[numAttribs++] = qpSetStringAttrib("CompileStatus", compileOk ? "OK" : "Fail");

	if (!qpXmlWriter_startElement(log->writer, "CompileInfo", numAttribs, attribs) ||
		!qpXmlWriter_writeStringElement(log->writer, "InfoLog", infoLog) ||
		!qpXmlWriter_endElement(log->writer, "CompileInfo"))
	{
		qpPrintf("qpTestLog_writeCompileInfo(): Writing XML failed\n");
		deMutex_unlock(log->lock);
		return DE_FALSE;
	}

	deMutex_unlock(log->lock);
	return DE_TRUE;
}